

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

Iterator<int,_false,_std::allocator<unsigned_long>_> * __thiscall
andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
          (Iterator<int,_false,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Iterator<int,_false,_std::allocator<unsigned_long>_> *this,int param_1)

{
  marray_detail::Assert<bool>(this->index_ != 0 && this->view_ != (view_pointer)0x0);
  Iterator(__return_storage_ptr__,this);
  operator--(this);
  return __return_storage_ptr__;
}

Assistant:

inline Iterator<T, isConst, A> 
Iterator<T, isConst, A>::operator--(int)
{
    marray_detail::Assert(MARRAY_NO_DEBUG || (view_ != 0 && index_ > 0));
    Iterator<T, isConst, A> copy = *this;
    --(*this);
    return copy;
}